

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_tan>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [24];
  undefined1 auVar64 [24];
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  ulong uVar110;
  float fVar111;
  ulong uVar112;
  float fVar113;
  long *in_RDI;
  float fVar114;
  undefined1 auVar115 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_tan op;
  Mat *m;
  __m256 ytan;
  __m256 _tmp;
  __m256 mask;
  __m256 eps;
  __m256 ycos;
  __m256 ysin;
  __m256 ysin1;
  __m256 ysin2;
  __m256 y2;
  __m256 z;
  __m256 sign_bit_cos;
  imm_xmm_union u_4;
  __m256 poly_mask;
  __m256 swap_sign_bit_sin;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m128i imm4_2;
  __m128i imm4_1;
  __m128i imm2_2;
  __m128i imm2_1;
  __m128i imm0_2;
  __m128i imm0_1;
  __m256i imm4;
  __m256i imm2;
  __m256i imm0;
  __m256 y;
  __m256 sign_bit_sin;
  __m256 xmm3;
  __m256 xmm2;
  __m256 xmm1;
  __m128 ytan_1;
  __m128 _tmp_1;
  __m128 mask_1;
  __m128 eps_1;
  __m128 ycos_1;
  __m128 ysin_1;
  v4sf ysin1_1;
  v4sf ysin2_1;
  v4sf y2_1;
  v4sf z_1;
  v4sf sign_bit_cos_1;
  v4sf poly_mask_1;
  v4sf swap_sign_bit_sin_1;
  v4si emm4;
  v4si emm2;
  v4si emm0;
  v4sf y_1;
  v4sf sign_bit_sin_1;
  v4sf xmm3_1;
  v4sf xmm2_1;
  v4sf xmm1_1;
  undefined8 local_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  int local_1b3c;
  undefined8 local_1b38;
  undefined8 local_1b30;
  undefined8 local_1b28;
  undefined4 local_1b20;
  long local_1b18;
  undefined4 local_1b10;
  undefined4 local_1b0c;
  undefined4 local_1b08;
  undefined4 local_1b04;
  undefined4 local_1b00;
  undefined8 local_1af8;
  undefined1 (*local_1af0) [32];
  int local_1ae8;
  int local_1ae4;
  int local_1ae0;
  int local_1adc;
  int local_1ad8;
  int local_1ad4;
  int local_1ad0;
  undefined1 local_1ac9 [9];
  long *local_1ac0;
  undefined1 local_1ab5;
  int local_1ab4;
  undefined8 *local_1aa8;
  undefined8 *local_1aa0;
  undefined8 *local_1a90;
  undefined1 (*local_1a88) [32];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined1 (*local_1a50) [32];
  undefined1 (*local_1a48) [32];
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined1 (*local_1a30) [32];
  long local_1a28;
  undefined4 local_1a1c;
  long local_1a18;
  undefined1 (*local_1a10) [32];
  undefined4 local_1a04;
  int local_1a00;
  int local_19fc;
  undefined8 *local_19f8;
  undefined4 local_19ec;
  long local_19e8;
  undefined8 *local_19d8;
  undefined8 *local_19b0;
  undefined1 *local_19a8;
  undefined8 *local_19a0;
  undefined1 *local_1998;
  undefined1 (*local_1990) [32];
  undefined1 *local_1988;
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined1 local_1940 [32];
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float fStack_18e4;
  undefined1 local_18e0 [32];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined1 local_1860 [32];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined4 local_17e4;
  undefined1 local_17e0 [32];
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [8];
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  undefined4 uStack_1770;
  undefined4 uStack_176c;
  undefined4 uStack_1768;
  undefined4 uStack_1764;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  int local_1680;
  int iStack_167c;
  int iStack_1678;
  int iStack_1674;
  int iStack_1670;
  int iStack_166c;
  int iStack_1668;
  int iStack_1664;
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  undefined1 local_1620 [16];
  undefined1 local_1610 [16];
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined1 local_15a0 [8];
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  float *local_14f0;
  undefined1 *local_14e8;
  undefined1 local_14e0 [32];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 *local_11b8;
  undefined1 *local_11b0;
  undefined1 *local_11a8;
  float *local_11a0;
  float *local_1198;
  undefined1 *local_1190;
  float *local_1188;
  float *local_1180;
  undefined1 *local_1178;
  float *local_1170;
  float *local_1168;
  undefined1 *local_1160;
  float *local_1158;
  float *local_1150;
  undefined1 *local_1148;
  undefined1 *local_1140;
  undefined8 *local_1138;
  undefined1 *local_1130;
  undefined1 *local_1128;
  undefined8 *local_1120;
  undefined1 *local_1118;
  undefined1 *local_1110;
  undefined8 *local_1108;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  float *local_10f0;
  float *local_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0 [2];
  float afStack_ed8 [2];
  float afStack_ed0 [2];
  float afStack_ec8 [2];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80 [2];
  float afStack_e78 [2];
  float afStack_e70 [2];
  float afStack_e68 [2];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  float local_e20 [2];
  float afStack_e18 [2];
  float afStack_e10 [2];
  float afStack_e08 [2];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  float local_dc0 [2];
  float afStack_db8 [2];
  float afStack_db0 [2];
  float afStack_da8 [2];
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  float local_ce0 [2];
  float afStack_cd8 [2];
  float afStack_cd0 [2];
  float afStack_cc8 [2];
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined4 local_c54;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined4 local_c34;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined4 local_c14;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined4 local_bf4;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  ulong uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  ulong uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined8 local_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined1 local_810 [16];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined4 local_7e0;
  undefined4 uStack_7dc;
  undefined4 uStack_7d8;
  undefined4 uStack_7d4;
  undefined4 local_7c4;
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  ulong local_760;
  ulong uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [8];
  undefined8 uStack_718;
  ulong local_710;
  ulong uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  float *local_6d0;
  undefined1 *local_6c8;
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  ulong local_690;
  ulong uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [16];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined4 local_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined4 local_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined1 *local_448;
  float *local_440;
  float *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  float *local_418;
  float *local_410;
  undefined1 *local_408;
  float *local_400;
  float *local_3f8;
  undefined1 *local_3f0;
  float *local_3e8;
  float *local_3e0;
  undefined1 *local_3d8;
  float *local_3d0;
  float *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  undefined8 *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  undefined8 *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined8 *local_380;
  undefined1 *local_378;
  undefined8 local_370;
  undefined8 uStack_368;
  float local_360 [2];
  float afStack_358 [2];
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float local_2b0 [2];
  float afStack_2a8 [2];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  float local_280 [2];
  float afStack_278 [2];
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_250 [2];
  float afStack_248 [2];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  float local_220 [2];
  float afStack_218 [2];
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  ulong uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  ulong local_f0;
  ulong uStack_e8;
  ulong local_e0;
  ulong uStack_d8;
  ulong local_d0;
  ulong uStack_c8;
  ulong local_c0;
  ulong uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  ulong uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  
  local_1ad0 = *(int *)((long)in_RDI + 0x2c);
  local_1ad4 = (int)in_RDI[6];
  local_1ad8 = *(int *)((long)in_RDI + 0x34);
  local_1adc = (int)in_RDI[7];
  local_1ae0 = (int)in_RDI[3];
  local_1ae4 = local_1ad0 * local_1ad4 * local_1ad8 * local_1ae0;
  local_1ac0 = in_RDI;
  for (local_1ae8 = 0; local_1ae8 < local_1adc; local_1ae8 = local_1ae8 + 1) {
    local_1aa8 = &local_1b38;
    local_19fc = *(int *)((long)local_1ac0 + 0x2c);
    local_1a00 = (int)local_1ac0[6];
    local_1a04 = *(undefined4 *)((long)local_1ac0 + 0x34);
    local_1a10 = (undefined1 (*) [32])
                 (*local_1ac0 + local_1ac0[8] * (long)local_1ae8 * local_1ac0[2]);
    local_1a18 = local_1ac0[2];
    local_1a1c = (undefined4)local_1ac0[3];
    local_1a28 = local_1ac0[4];
    local_19f8 = &local_1b38;
    local_19e8 = (long)local_19fc * (long)local_1a00 * local_1a18;
    local_1aa0 = &local_1b38;
    local_1a90 = &local_1b38;
    local_19ec = 0x10;
    local_1ab4 = local_1ae8;
    local_1ab5 = 1;
    local_1b38 = 0;
    local_1b28 = 0;
    local_1b20 = 0;
    local_1b10 = 0;
    local_1b0c = 0;
    local_1b08 = 0;
    local_1b04 = 0;
    local_1b00 = 0;
    local_1af8 = 0;
    local_1b30 = 0;
    local_1af0 = local_1a10;
    for (local_1b3c = 0; fVar107 = uStack_1508._4_4_, fVar106 = uStack_1510._4_4_,
        fVar105 = uStack_1518._4_4_, fVar104 = local_1520._4_4_, fVar103 = uStack_1528._4_4_,
        fVar102 = uStack_1530._4_4_, fVar101 = uStack_1538._4_4_, fVar114 = local_1540._4_4_,
        local_1b3c + 7 < local_1ae4; local_1b3c = local_1b3c + 8) {
      local_1a88 = local_1af0;
      local_18c0 = *(undefined8 *)*local_1af0;
      uStack_18b8 = *(undefined8 *)(*local_1af0 + 8);
      uStack_18b0 = *(undefined8 *)(*local_1af0 + 0x10);
      uStack_18a8 = *(undefined8 *)(*local_1af0 + 0x18);
      local_19a8 = local_1ac9;
      local_19b0 = &local_1b60;
      local_17e4 = 0x322bcc77;
      local_8a4 = 0x322bcc77;
      local_8a8 = 0x322bcc77;
      local_8ac = 0x322bcc77;
      local_8b0 = 0x322bcc77;
      local_8b4 = 0x322bcc77;
      local_8b8 = 0x322bcc77;
      local_8bc = 0x322bcc77;
      local_8c0 = 0x322bcc77;
      auVar4 = vinsertps_avx(ZEXT416(0x322bcc77),ZEXT416(0x322bcc77),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x322bcc77),0x20);
      local_8e0 = vinsertps_avx(auVar4,ZEXT416(0x322bcc77),0x30);
      auVar4 = vinsertps_avx(ZEXT416(0x322bcc77),ZEXT416(0x322bcc77),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x322bcc77),0x20);
      auStack_8d0 = vinsertps_avx(auVar4,ZEXT416(0x322bcc77),0x30);
      local_1920 = local_8e0._0_8_;
      uStack_1918 = local_8e0._8_8_;
      uStack_1910 = auStack_8d0._0_8_;
      uStack_1908 = auStack_8d0._8_8_;
      local_14e8 = local_18e0;
      local_14f0 = &local_1900;
      local_1860 = ZEXT832(0) << 0x20;
      local_14e0._0_8_ = SUB168(*(undefined1 (*) [16])*local_1af0,0);
      local_14e0._8_8_ = SUB168(*(undefined1 (*) [16])*local_1af0,8);
      local_13c0 = local_14e0._0_8_;
      uStack_13b8 = local_14e0._8_8_;
      local_13e0 = 0x7fffffff7fffffff;
      uStack_13d8 = 0x7fffffff7fffffff;
      uStack_13d0 = 0x7fffffff7fffffff;
      uStack_13c8 = 0x7fffffff7fffffff;
      auVar115._8_8_ = 0x7fffffff7fffffff;
      auVar115._0_8_ = 0x7fffffff7fffffff;
      auVar115._16_8_ = 0x7fffffff7fffffff;
      auVar115._24_8_ = 0x7fffffff7fffffff;
      auVar1 = vandps_avx(*local_1af0,auVar115);
      local_1400 = local_14e0._0_8_;
      uStack_13f8 = local_14e0._8_8_;
      local_1420 = 0x8000000080000000;
      uStack_1418 = 0x8000000080000000;
      uStack_1410 = 0x8000000080000000;
      uStack_1408 = 0x8000000080000000;
      auVar10._8_8_ = 0x8000000080000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._16_8_ = 0x8000000080000000;
      auVar10._24_8_ = 0x8000000080000000;
      auVar2 = vandps_avx(*local_1af0,auVar10);
      local_14e0._0_8_ = auVar1._0_8_;
      local_14e0._8_8_ = auVar1._8_8_;
      local_14e0._16_8_ = auVar1._16_8_;
      local_14e0._24_8_ = auVar1._24_8_;
      local_11e0 = local_14e0._0_8_;
      uVar99 = local_11e0;
      uStack_11d8 = local_14e0._8_8_;
      uVar100 = uStack_11d8;
      uStack_11d0 = local_14e0._16_8_;
      uVar65 = uStack_11d0;
      uStack_11c8 = local_14e0._24_8_;
      uVar66 = uStack_11c8;
      local_1200 = 0x3fa2f9833fa2f983;
      uStack_11f8 = 0x3fa2f9833fa2f983;
      uStack_11f0 = 0x3fa2f9833fa2f983;
      uStack_11e8 = 0x3fa2f9833fa2f983;
      local_11e0._0_4_ = auVar1._0_4_;
      local_11e0._4_4_ = auVar1._4_4_;
      uStack_11d8._0_4_ = auVar1._8_4_;
      uStack_11d8._4_4_ = auVar1._12_4_;
      uStack_11d0._0_4_ = auVar1._16_4_;
      uStack_11d0._4_4_ = auVar1._20_4_;
      uStack_11c8._0_4_ = auVar1._24_4_;
      uStack_11c8._4_4_ = auVar1._28_4_;
      local_15a0._4_4_ = local_11e0._4_4_ * 1.2732395;
      local_15a0._0_4_ = (float)local_11e0 * 1.2732395;
      uStack_1598._0_4_ = (float)uStack_11d8 * 1.2732395;
      uStack_1598._4_4_ = uStack_11d8._4_4_ * 1.2732395;
      uStack_1590._0_4_ = (float)uStack_11d0 * 1.2732395;
      uStack_1590._4_4_ = uStack_11d0._4_4_ * 1.2732395;
      auVar63 = _local_15a0;
      uStack_1588._0_4_ = (float)uStack_11c8 * 1.2732395;
      uStack_1588._4_4_ = uStack_11c8._4_4_;
      auVar3 = _local_15a0;
      uStack_1590 = auVar63._16_8_;
      uStack_1588 = auVar3._24_8_;
      local_1020 = local_15a0;
      uStack_1018 = uStack_1598;
      uStack_1010 = uStack_1590;
      uStack_1008 = uStack_1588;
      local_1680 = (int)((float)local_11e0 * 1.2732395);
      iStack_167c = (int)(local_11e0._4_4_ * 1.2732395);
      iStack_1678 = (int)((float)uStack_11d8 * 1.2732395);
      iStack_1674 = (int)(uStack_11d8._4_4_ * 1.2732395);
      iStack_1670 = (int)((float)uStack_11d0 * 1.2732395);
      iStack_166c = (int)(uStack_11d0._4_4_ * 1.2732395);
      iStack_1668 = (int)((float)uStack_11c8 * 1.2732395);
      iStack_1664 = (int)uStack_11c8._4_4_;
      local_c70 = CONCAT44(iStack_167c,local_1680);
      uStack_c68 = CONCAT44(iStack_1674,iStack_1678);
      local_c90 = CONCAT44(iStack_166c,iStack_1670);
      uStack_c88 = CONCAT44(iStack_1664,iStack_1668);
      local_c80 = 0x100000001;
      uStack_c78 = 0x100000001;
      auVar7._8_8_ = uStack_c68;
      auVar7._0_8_ = local_c70;
      auVar4._8_8_ = 0x100000001;
      auVar4._0_8_ = 0x100000001;
      auVar4 = vpaddd_avx(auVar7,auVar4);
      local_ca0 = 0x100000001;
      uStack_c98 = 0x100000001;
      auVar6._8_8_ = uStack_c88;
      auVar6._0_8_ = local_c90;
      auVar5._8_8_ = 0x100000001;
      auVar5._0_8_ = 0x100000001;
      auVar5 = vpaddd_avx(auVar6,auVar5);
      local_1630._0_8_ = auVar4._0_8_;
      local_1630._8_8_ = auVar4._8_8_;
      local_ad0 = local_1630._0_8_;
      uStack_ac8 = local_1630._8_8_;
      local_ae0 = 0xfffffffefffffffe;
      uStack_ad8 = 0xfffffffefffffffe;
      auVar24._8_8_ = 0xfffffffefffffffe;
      auVar24._0_8_ = 0xfffffffefffffffe;
      auVar4 = vpand_avx(auVar4,auVar24);
      local_1640._0_8_ = auVar5._0_8_;
      local_1640._8_8_ = auVar5._8_8_;
      local_af0 = local_1640._0_8_;
      uStack_ae8 = local_1640._8_8_;
      local_b00 = 0xfffffffefffffffe;
      uStack_af8 = 0xfffffffefffffffe;
      auVar23._8_8_ = 0xfffffffefffffffe;
      auVar23._0_8_ = 0xfffffffefffffffe;
      auVar5 = vpand_avx(auVar5,auVar23);
      local_1630._0_8_ = auVar4._0_8_;
      local_b90 = local_1630._0_8_;
      local_1630._8_8_ = auVar4._8_8_;
      uStack_b88 = local_1630._8_8_;
      local_16a0 = local_1630._0_8_;
      uStack_1698 = local_1630._8_8_;
      local_1640._0_8_ = auVar5._0_8_;
      local_bb0 = local_1640._0_8_;
      local_1640._8_8_ = auVar5._8_8_;
      uStack_ba8 = local_1640._8_8_;
      uStack_1690 = local_1640._0_8_;
      uStack_1688 = local_1640._8_8_;
      local_be0 = local_1630._0_8_;
      uStack_bd8 = local_1630._8_8_;
      uStack_bd0 = local_1640._0_8_;
      uStack_bc8 = local_1640._8_8_;
      auVar17._16_8_ = local_1640._0_8_;
      auVar17._0_16_ = auVar4;
      auVar17._24_8_ = local_1640._8_8_;
      auVar3 = vcvtdq2ps_avx(auVar17);
      local_b10 = local_1630._0_8_;
      uStack_b08 = local_1630._8_8_;
      local_b20 = 0x400000004;
      uStack_b18 = 0x400000004;
      auVar22._8_8_ = 0x400000004;
      auVar22._0_8_ = 0x400000004;
      auVar6 = vpand_avx(auVar4,auVar22);
      local_b30 = local_1640._0_8_;
      uStack_b28 = local_1640._8_8_;
      local_b40 = 0x400000004;
      uStack_b38 = 0x400000004;
      auVar21._8_8_ = 0x400000004;
      auVar21._0_8_ = 0x400000004;
      auVar7 = vpand_avx(auVar5,auVar21);
      local_1610._0_8_ = auVar6._0_8_;
      local_1610._8_8_ = auVar6._8_8_;
      local_bf0 = local_1610._0_8_;
      uStack_be8 = local_1610._8_8_;
      local_bf4 = 0x1d;
      local_1610 = vpslld_avx(auVar6,ZEXT416(0x1d));
      local_1620._0_8_ = auVar7._0_8_;
      local_1620._8_8_ = auVar7._8_8_;
      local_c10 = local_1620._0_8_;
      uStack_c08 = local_1620._8_8_;
      local_c14 = 0x1d;
      local_1620 = vpslld_avx(auVar7,ZEXT416(0x1d));
      local_16c0 = local_1610._0_8_;
      uStack_16b8 = local_1610._8_8_;
      uStack_16b0 = local_1620._0_8_;
      uStack_16a8 = local_1620._8_8_;
      local_15c0 = local_1610._0_8_;
      uStack_15b8 = local_1610._8_8_;
      uStack_15b0 = local_1620._0_8_;
      uStack_15a8 = local_1620._8_8_;
      local_b50 = local_1630._0_8_;
      uStack_b48 = local_1630._8_8_;
      local_b60 = 0x200000002;
      uStack_b58 = 0x200000002;
      auVar20._8_8_ = 0x200000002;
      auVar20._0_8_ = 0x200000002;
      auVar6 = vpand_avx(auVar4,auVar20);
      local_b70 = local_1640._0_8_;
      uStack_b68 = local_1640._8_8_;
      local_b80 = 0x200000002;
      uStack_b78 = 0x200000002;
      auVar19._8_8_ = 0x200000002;
      auVar19._0_8_ = 0x200000002;
      auVar7 = vpand_avx(auVar5,auVar19);
      local_1630._0_8_ = auVar6._0_8_;
      local_1630._8_8_ = auVar6._8_8_;
      local_a80 = ZEXT816(0) << 0x20;
      local_a70._8_8_ = SUB168(ZEXT816(0),4);
      local_a90 = local_1630._0_8_;
      uStack_a88 = local_1630._8_8_;
      local_aa0 = 0;
      uStack_a98 = local_a70._8_8_;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_a70._8_8_;
      local_1630 = vpcmpeqd_avx(auVar6,auVar59 << 0x40);
      local_1640._0_8_ = auVar7._0_8_;
      local_1640._8_8_ = auVar7._8_8_;
      local_ab0 = local_1640._0_8_;
      uStack_aa8 = local_1640._8_8_;
      local_ac0 = 0;
      uStack_ab8 = local_a70._8_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_a70._8_8_;
      local_1640 = vpcmpeqd_avx(auVar7,auVar60 << 0x40);
      local_16e0 = local_1630._0_8_;
      uStack_16d8 = local_1630._8_8_;
      uStack_16d0 = local_1640._0_8_;
      uStack_16c8 = local_1640._8_8_;
      local_15e0 = local_1630._0_8_;
      uStack_15d8 = local_1630._8_8_;
      uStack_15d0 = local_1640._0_8_;
      uStack_15c8 = local_1640._8_8_;
      local_1480 = local_1610._0_8_;
      uStack_1478 = local_1610._8_8_;
      uStack_1470 = local_1620._0_8_;
      uStack_1468 = local_1620._8_8_;
      local_1700 = local_1610._0_8_;
      uStack_16f8 = local_1610._8_8_;
      uStack_16f0 = local_1620._0_8_;
      uStack_16e8 = local_1620._8_8_;
      local_14a0 = local_1630._0_8_;
      uStack_1498 = local_1630._8_8_;
      uStack_1490 = local_1640._0_8_;
      uStack_1488 = local_1640._8_8_;
      local_1720 = local_1630._0_8_;
      uStack_1718 = local_1630._8_8_;
      uStack_1710 = local_1640._0_8_;
      uStack_1708 = local_1640._8_8_;
      local_1160 = local_15a0;
      local_1108 = &local_1520;
      local_11b8 = local_14e0;
      local_15a0 = auVar3._0_8_;
      local_fc0 = local_15a0;
      uStack_1598 = auVar3._8_8_;
      uStack_fb8 = uStack_1598;
      uStack_1590 = auVar3._16_8_;
      uStack_fb0 = uStack_1590;
      uStack_1588 = auVar3._24_8_;
      uStack_fa8 = uStack_1588;
      local_fe0 = 0xbf490000bf490000;
      uStack_fd8 = 0xbf490000bf490000;
      uStack_fd0 = 0xbf490000bf490000;
      uStack_fc8 = 0xbf490000bf490000;
      auVar50._8_4_ = 0xbf490000;
      auVar50._0_8_ = 0xbf490000bf490000;
      auVar50._12_4_ = 0xbf490000;
      auVar50._16_4_ = 0xbf490000;
      auVar50._20_4_ = 0xbf490000;
      auVar50._24_4_ = 0xbf490000;
      auVar50._28_4_ = 0xbf490000;
      local_1000 = local_14e0._0_8_;
      uStack_ff8 = local_14e0._8_8_;
      uStack_ff0 = local_14e0._16_8_;
      uStack_fe8 = local_14e0._24_8_;
      auVar6 = vfmadd213ps_fma(auVar50,auVar3,auVar1);
      local_1120 = &local_1540;
      local_f60 = local_15a0;
      uStack_f58 = uStack_1598;
      uStack_f50 = uStack_1590;
      uStack_f48 = uStack_1588;
      local_f80 = 0xb97da000b97da000;
      uStack_f78 = 0xb97da000b97da000;
      uStack_f70 = 0xb97da000b97da000;
      uStack_f68 = 0xb97da000b97da000;
      auVar49._8_4_ = 0xb97da000;
      auVar49._0_8_ = 0xb97da000b97da000;
      auVar49._12_4_ = 0xb97da000;
      auVar49._16_4_ = 0xb97da000;
      auVar49._20_4_ = 0xb97da000;
      auVar49._24_4_ = 0xb97da000;
      auVar49._28_4_ = 0xb97da000;
      local_14e0._0_8_ = auVar6._0_8_;
      local_fa0 = local_14e0._0_8_;
      local_14e0._8_8_ = auVar6._8_8_;
      uStack_f98 = local_14e0._8_8_;
      uStack_f90 = 0;
      uStack_f88 = 0;
      auVar6 = vfmadd213ps_fma(auVar49,auVar3,ZEXT1632(auVar6));
      local_1138 = &local_1560;
      local_f00 = local_15a0;
      uStack_ef8 = uStack_1598;
      uStack_ef0 = uStack_1590;
      uStack_ee8 = uStack_1588;
      local_f20 = 0xb3222169b3222169;
      uStack_f18 = 0xb3222169b3222169;
      uStack_f10 = 0xb3222169b3222169;
      uStack_f08 = 0xb3222169b3222169;
      auVar48._8_8_ = 0xb3222169b3222169;
      auVar48._0_8_ = 0xb3222169b3222169;
      auVar48._16_8_ = 0xb3222169b3222169;
      auVar48._24_8_ = 0xb3222169b3222169;
      local_14e0._0_8_ = auVar6._0_8_;
      local_f40 = local_14e0._0_8_;
      local_14e0._8_8_ = auVar6._8_8_;
      uStack_f38 = local_14e0._8_8_;
      uStack_f30 = 0;
      uStack_f28 = 0;
      auVar6 = vfmadd213ps_fma(auVar48,auVar3,ZEXT1632(auVar6));
      auVar115 = ZEXT1632(auVar6);
      local_ba0 = 0x200000002;
      uStack_b98 = 0x200000002;
      auVar18._8_8_ = 0x200000002;
      auVar18._0_8_ = 0x200000002;
      auVar4 = vpsubd_avx(auVar4,auVar18);
      local_bc0 = 0x200000002;
      uStack_bb8 = 0x200000002;
      auVar8._8_8_ = 0x200000002;
      auVar8._0_8_ = 0x200000002;
      auVar5 = vpsubd_avx(auVar5,auVar8);
      local_1650._0_8_ = auVar4._0_8_;
      local_1650._8_8_ = auVar4._8_8_;
      local_930 = local_1650._0_8_;
      uStack_928 = local_1650._8_8_;
      local_940 = 0x400000004;
      uStack_938 = 0x400000004;
      auVar28._8_8_ = 0x400000004;
      auVar28._0_8_ = 0x400000004;
      auVar4 = vpandn_avx(auVar4,auVar28);
      local_1660._0_8_ = auVar5._0_8_;
      local_1660._8_8_ = auVar5._8_8_;
      local_950 = local_1660._0_8_;
      uStack_948 = local_1660._8_8_;
      local_960 = 0x400000004;
      uStack_958 = 0x400000004;
      auVar27._8_8_ = 0x400000004;
      auVar27._0_8_ = 0x400000004;
      auVar5 = vpandn_avx(auVar5,auVar27);
      local_1650._0_8_ = auVar4._0_8_;
      local_1650._8_8_ = auVar4._8_8_;
      local_c30 = local_1650._0_8_;
      uStack_c28 = local_1650._8_8_;
      local_c34 = 0x1d;
      local_1650 = vpslld_avx(auVar4,ZEXT416(0x1d));
      local_1660._0_8_ = auVar5._0_8_;
      local_1660._8_8_ = auVar5._8_8_;
      local_c50 = local_1660._0_8_;
      uStack_c48 = local_1660._8_8_;
      local_c54 = 0x1d;
      local_1660 = vpslld_avx(auVar5,ZEXT416(0x1d));
      local_1740 = local_1650._0_8_;
      uStack_1738 = local_1650._8_8_;
      uStack_1730 = local_1660._0_8_;
      uStack_1728 = local_1660._8_8_;
      local_1600 = local_1650._0_8_;
      uStack_15f8 = local_1650._8_8_;
      uStack_15f0 = local_1660._0_8_;
      uStack_15e8 = local_1660._8_8_;
      local_14c0 = local_1650._0_8_;
      uStack_14b8 = local_1650._8_8_;
      uStack_14b0 = local_1660._0_8_;
      uStack_14a8 = local_1660._8_8_;
      local_1760 = local_1650._0_8_;
      uStack_1758 = local_1650._8_8_;
      uStack_1750 = local_1660._0_8_;
      uStack_1748 = local_1660._8_8_;
      local_1580 = auVar2._0_8_;
      uStack_1578 = auVar2._8_8_;
      uStack_1570 = auVar2._16_8_;
      uStack_1568 = auVar2._24_8_;
      local_9c0 = local_1580;
      uVar89 = local_9c0;
      uStack_9b8 = uStack_1578;
      uVar90 = uStack_9b8;
      uStack_9b0 = uStack_1570;
      uVar91 = uStack_9b0;
      uStack_9a8 = uStack_1568;
      uVar92 = uStack_9a8;
      local_9e0 = local_1610._0_8_;
      uVar85 = local_9e0;
      uStack_9d8 = local_1610._8_8_;
      uVar86 = uStack_9d8;
      uStack_9d0 = local_1620._0_8_;
      uVar87 = uStack_9d0;
      uStack_9c8 = local_1620._8_8_;
      uVar88 = uStack_9c8;
      local_9c0._0_4_ = auVar2._0_4_;
      local_9c0._4_4_ = auVar2._4_4_;
      uStack_9b8._0_4_ = auVar2._8_4_;
      uStack_9b8._4_4_ = auVar2._12_4_;
      uStack_9b0._0_4_ = auVar2._16_4_;
      uStack_9b0._4_4_ = auVar2._20_4_;
      uStack_9a8._0_4_ = auVar2._24_4_;
      uStack_9a8._4_4_ = auVar2._28_4_;
      local_9e0._0_4_ = local_1610._0_4_;
      local_9e0._4_4_ = local_1610._4_4_;
      uStack_9d8._0_4_ = local_1610._8_4_;
      uStack_9d8._4_4_ = local_1610._12_4_;
      uStack_9d0._0_4_ = local_1620._0_4_;
      uStack_9d0._4_4_ = local_1620._4_4_;
      uStack_9c8._0_4_ = local_1620._8_4_;
      uStack_9c8._4_4_ = local_1620._12_4_;
      local_1580 = CONCAT44(local_9c0._4_4_ ^ local_9e0._4_4_,(uint)local_9c0 ^ (uint)local_9e0);
      uStack_1578._0_4_ = (uint)uStack_9b8 ^ (uint)uStack_9d8;
      uStack_1578._4_4_ = uStack_9b8._4_4_ ^ uStack_9d8._4_4_;
      uStack_1570._0_4_ = (uint)uStack_9b0 ^ (uint)uStack_9d0;
      uStack_1570._4_4_ = uStack_9b0._4_4_ ^ uStack_9d0._4_4_;
      auVar64 = _local_1580;
      uStack_1568._0_4_ = (uint)uStack_9a8 ^ (uint)uStack_9c8;
      uStack_1568._4_4_ = uStack_9a8._4_4_ ^ uStack_9c8._4_4_;
      auVar10 = _local_1580;
      local_14e0._0_8_ = auVar6._0_8_;
      local_14e0._8_8_ = auVar6._8_8_;
      local_1220 = local_14e0._0_8_;
      uVar97 = local_1220;
      uStack_1218 = local_14e0._8_8_;
      uVar98 = uStack_1218;
      uStack_1210 = 0;
      uStack_1208 = 0;
      local_1240 = local_14e0._0_8_;
      uStack_1238 = local_14e0._8_8_;
      uStack_1230 = 0;
      uStack_1228 = 0;
      local_1220._0_4_ = auVar6._0_4_;
      local_1220._4_4_ = auVar6._4_4_;
      uStack_1218._0_4_ = auVar6._8_4_;
      uStack_1218._4_4_ = auVar6._12_4_;
      local_1780 = (float)local_1220 * (float)local_1220;
      fStack_177c = local_1220._4_4_ * local_1220._4_4_;
      fStack_1778 = (float)uStack_1218 * (float)uStack_1218;
      fStack_1774 = uStack_1218._4_4_ * uStack_1218._4_4_;
      uStack_1770 = 0;
      uStack_176c = 0;
      uStack_1768 = 0;
      uStack_1764 = 0;
      uStack_1598 = 0x37ccf5ce37ccf5ce;
      local_15a0 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      uStack_1590 = 0x37ccf5ce37ccf5ce;
      uStack_1588 = 0x37ccf5ce37ccf5ce;
      local_1198 = &local_1780;
      local_1158 = _ps256_coscof_p1;
      local_ea0 = 0x37ccf5ce37ccf5ce;
      uStack_e98 = 0x37ccf5ce37ccf5ce;
      uStack_e90 = 0x37ccf5ce37ccf5ce;
      uStack_e88 = 0x37ccf5ce37ccf5ce;
      local_ec0 = CONCAT44(fStack_177c,local_1780);
      uStack_eb8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_eb0 = 0;
      uStack_ea8 = 0;
      local_ee0[0] = -0.0013887316;
      local_ee0[1] = -0.0013887316;
      afStack_ed8[0] = -0.0013887316;
      afStack_ed8[1] = -0.0013887316;
      afStack_ed0[0] = -0.0013887316;
      afStack_ed0[1] = -0.0013887316;
      afStack_ec8[0] = -0.0013887316;
      afStack_ec8[1] = -0.0013887316;
      auVar12._8_4_ = -0.0013887316;
      auVar12._12_4_ = -0.0013887316;
      auVar12._0_4_ = -0.0013887316;
      auVar12._4_4_ = -0.0013887316;
      auVar12._16_4_ = -0.0013887316;
      auVar12._20_4_ = -0.0013887316;
      auVar12._24_4_ = -0.0013887316;
      auVar12._28_4_ = -0.0013887316;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1774,
                                                  CONCAT48(fStack_1778,
                                                           CONCAT44(fStack_177c,local_1780)))),
                               _local_15a0,auVar12);
      local_1170 = _ps256_coscof_p2;
      local_15a0 = auVar4._0_8_;
      local_e40 = local_15a0;
      uStack_1598 = auVar4._8_8_;
      uStack_e38 = uStack_1598;
      uStack_e30 = 0;
      uStack_e28 = 0;
      local_e60 = CONCAT44(fStack_177c,local_1780);
      uStack_e58 = CONCAT44(fStack_1774,fStack_1778);
      uStack_e50 = 0;
      uStack_e48 = 0;
      local_e80[0] = 0.041666646;
      local_e80[1] = 0.041666646;
      afStack_e78[0] = 0.041666646;
      afStack_e78[1] = 0.041666646;
      afStack_e70[0] = 0.041666646;
      afStack_e70[1] = 0.041666646;
      afStack_e68[0] = 0.041666646;
      afStack_e68[1] = 0.041666646;
      auVar13._8_4_ = 0.041666646;
      auVar13._12_4_ = 0.041666646;
      auVar13._0_4_ = 0.041666646;
      auVar13._4_4_ = 0.041666646;
      auVar13._16_4_ = 0.041666646;
      auVar13._20_4_ = 0.041666646;
      auVar13._24_4_ = 0.041666646;
      auVar13._28_4_ = 0.041666646;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1774,
                                                  CONCAT48(fStack_1778,
                                                           CONCAT44(fStack_177c,local_1780)))),
                               ZEXT1632(auVar4),auVar13);
      local_15a0 = auVar4._0_8_;
      uStack_1598 = auVar4._8_8_;
      local_1280 = CONCAT44(fStack_177c,local_1780);
      uStack_1278 = CONCAT44(fStack_1774,fStack_1778);
      uStack_1270 = 0;
      uStack_1268 = 0;
      local_1260 = local_15a0;
      uVar95 = local_1260;
      uStack_1258 = uStack_1598;
      uVar96 = uStack_1258;
      uStack_1250 = 0;
      uStack_1248 = 0;
      local_1260._0_4_ = auVar4._0_4_;
      local_1260._4_4_ = auVar4._4_4_;
      uStack_1258._0_4_ = auVar4._8_4_;
      uStack_1258._4_4_ = auVar4._12_4_;
      local_15a0._4_4_ = local_1260._4_4_ * fStack_177c;
      local_15a0._0_4_ = (float)local_1260 * local_1780;
      uStack_1598._0_4_ = (float)uStack_1258 * fStack_1778;
      uStack_1598._4_4_ = uStack_1258._4_4_ * fStack_1774;
      local_12c0 = CONCAT44(fStack_177c,local_1780);
      uStack_12b8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_12b0 = 0;
      uStack_12a8 = 0;
      local_12a0 = local_15a0;
      uStack_1298 = uStack_1598;
      uStack_1290 = 0;
      uStack_1288 = 0;
      local_15a0._4_4_ = local_1260._4_4_ * fStack_177c * fStack_177c;
      local_15a0._0_4_ = (float)local_1260 * local_1780 * local_1780;
      local_d00 = local_15a0;
      uStack_1598._0_4_ = (float)uStack_1258 * fStack_1778 * fStack_1778;
      uStack_1598._4_4_ = uStack_1258._4_4_ * fStack_1774 * fStack_1774;
      auVar4 = _local_15a0;
      _local_15a0 = ZEXT1632(_local_15a0);
      auVar1 = _local_15a0;
      local_10f0 = ::_ps256_0p5;
      local_cc0 = CONCAT44(fStack_177c,local_1780);
      uStack_cb8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_cb0 = 0;
      uStack_ca8 = 0;
      local_ce0[0] = 0.5;
      local_ce0[1] = 0.5;
      afStack_cd8[0] = 0.5;
      afStack_cd8[1] = 0.5;
      afStack_cd0[0] = 0.5;
      afStack_cd0[1] = 0.5;
      afStack_cc8[0] = 0.5;
      afStack_cc8[1] = 0.5;
      uStack_1598 = auVar4._8_8_;
      uStack_cf8 = uStack_1598;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      auVar16._8_4_ = 0.5;
      auVar16._12_4_ = 0.5;
      auVar16._0_4_ = 0.5;
      auVar16._4_4_ = 0.5;
      auVar16._16_4_ = 0.5;
      auVar16._20_4_ = 0.5;
      auVar16._24_4_ = 0.5;
      auVar16._28_4_ = 0.5;
      auVar4 = vfnmadd213ps_fma(auVar16,ZEXT1632(CONCAT412(fStack_1774,
                                                           CONCAT48(fStack_1778,
                                                                    CONCAT44(fStack_177c,local_1780)
                                                                   ))),auVar1);
      local_15a0 = auVar4._0_8_;
      uStack_1598 = auVar4._8_8_;
      local_1040 = local_15a0;
      uVar83 = local_1040;
      uStack_1038 = uStack_1598;
      uVar84 = uStack_1038;
      uStack_1030 = 0;
      uStack_1028 = 0;
      local_1060 = 0x3f8000003f800000;
      uStack_1058 = 0x3f8000003f800000;
      uStack_1050 = 0x3f8000003f800000;
      uStack_1048 = 0x3f8000003f800000;
      local_1040._0_4_ = auVar4._0_4_;
      local_1040._4_4_ = auVar4._4_4_;
      uStack_1038._0_4_ = auVar4._8_4_;
      uStack_1038._4_4_ = auVar4._12_4_;
      local_15a0._4_4_ = local_1040._4_4_ + 1.0;
      local_15a0._0_4_ = (float)local_1040 + 1.0;
      uStack_1598._0_4_ = (float)uStack_1038 + 1.0;
      uStack_1598._4_4_ = uStack_1038._4_4_ + 1.0;
      uStack_1590._0_4_ = 0x3f800000;
      uStack_1590._4_4_ = 0x3f800000;
      auVar63 = _local_15a0;
      uStack_1588._0_4_ = 0x3f800000;
      uStack_1588._4_4_ = 0x3f800000;
      auVar2 = _local_15a0;
      uStack_1798 = 0xb94ca1f9b94ca1f9;
      local_17a0 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      uStack_1790 = 0xb94ca1f9b94ca1f9;
      uStack_1788 = 0xb94ca1f9b94ca1f9;
      local_11a8 = local_17a0;
      local_1188 = _ps256_sincof_p1;
      local_de0 = 0xb94ca1f9b94ca1f9;
      uStack_dd8 = 0xb94ca1f9b94ca1f9;
      uStack_dd0 = 0xb94ca1f9b94ca1f9;
      uStack_dc8 = 0xb94ca1f9b94ca1f9;
      local_e00 = CONCAT44(fStack_177c,local_1780);
      uStack_df8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_df0 = 0;
      uStack_de8 = 0;
      local_e20[0] = 0.008332161;
      local_e20[1] = 0.008332161;
      afStack_e18[0] = 0.008332161;
      afStack_e18[1] = 0.008332161;
      afStack_e10[0] = 0.008332161;
      afStack_e10[1] = 0.008332161;
      afStack_e08[0] = 0.008332161;
      afStack_e08[1] = 0.008332161;
      auVar14._8_4_ = 0.008332161;
      auVar14._12_4_ = 0.008332161;
      auVar14._0_4_ = 0.008332161;
      auVar14._4_4_ = 0.008332161;
      auVar14._16_4_ = 0.008332161;
      auVar14._20_4_ = 0.008332161;
      auVar14._24_4_ = 0.008332161;
      auVar14._28_4_ = 0.008332161;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1774,
                                                  CONCAT48(fStack_1778,
                                                           CONCAT44(fStack_177c,local_1780)))),
                               _local_17a0,auVar14);
      local_11a0 = _ps256_sincof_p2;
      local_17a0 = auVar4._0_8_;
      local_d80 = local_17a0;
      uStack_1798 = auVar4._8_8_;
      uStack_d78 = uStack_1798;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_da0 = CONCAT44(fStack_177c,local_1780);
      uStack_d98 = CONCAT44(fStack_1774,fStack_1778);
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_dc0[0] = -0.16666655;
      local_dc0[1] = -0.16666655;
      afStack_db8[0] = -0.16666655;
      afStack_db8[1] = -0.16666655;
      afStack_db0[0] = -0.16666655;
      afStack_db0[1] = -0.16666655;
      afStack_da8[0] = -0.16666655;
      afStack_da8[1] = -0.16666655;
      auVar15._8_4_ = -0.16666655;
      auVar15._12_4_ = -0.16666655;
      auVar15._0_4_ = -0.16666655;
      auVar15._4_4_ = -0.16666655;
      auVar15._16_4_ = -0.16666655;
      auVar15._20_4_ = -0.16666655;
      auVar15._24_4_ = -0.16666655;
      auVar15._28_4_ = -0.16666655;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_1774,
                                                  CONCAT48(fStack_1778,
                                                           CONCAT44(fStack_177c,local_1780)))),
                               ZEXT1632(auVar4),auVar15);
      local_17a0 = auVar4._0_8_;
      uStack_1798 = auVar4._8_8_;
      local_1300 = CONCAT44(fStack_177c,local_1780);
      uStack_12f8 = CONCAT44(fStack_1774,fStack_1778);
      uStack_12f0 = 0;
      uStack_12e8 = 0;
      local_12e0 = local_17a0;
      uVar93 = local_12e0;
      uStack_12d8 = uStack_1798;
      uVar94 = uStack_12d8;
      uStack_12d0 = 0;
      uStack_12c8 = 0;
      local_12e0._0_4_ = auVar4._0_4_;
      local_12e0._4_4_ = auVar4._4_4_;
      uStack_12d8._0_4_ = auVar4._8_4_;
      uStack_12d8._4_4_ = auVar4._12_4_;
      local_17a0._4_4_ = local_12e0._4_4_ * fStack_177c;
      local_17a0._0_4_ = (float)local_12e0 * local_1780;
      local_d20 = local_17a0;
      uStack_1798._0_4_ = (float)uStack_12d8 * fStack_1778;
      uStack_1798._4_4_ = uStack_12d8._4_4_ * fStack_1774;
      auVar4 = _local_17a0;
      _local_17a0 = ZEXT1632(_local_17a0);
      auVar1 = _local_17a0;
      uStack_1798 = auVar4._8_8_;
      uStack_d18 = uStack_1798;
      uStack_d10 = 0;
      uStack_d08 = 0;
      local_d40 = local_14e0._0_8_;
      uStack_d38 = local_14e0._8_8_;
      uStack_d30 = 0;
      uStack_d28 = 0;
      local_d60 = local_14e0._0_8_;
      uStack_d58 = local_14e0._8_8_;
      uStack_d50 = 0;
      uStack_d48 = 0;
      auVar4 = vfmadd213ps_fma(auVar115,auVar1,auVar115);
      local_1560 = local_1630._0_8_;
      uStack_1558 = local_1630._8_8_;
      uStack_1550 = local_1640._0_8_;
      uStack_1548 = local_1640._8_8_;
      local_17a0 = auVar4._0_8_;
      uStack_1798 = auVar4._8_8_;
      local_1440 = local_1630._0_8_;
      uStack_1438 = local_1630._8_8_;
      uStack_1430 = local_1640._0_8_;
      uStack_1428 = local_1640._8_8_;
      local_1460 = local_17a0;
      uStack_1458 = uStack_1798;
      uStack_1450 = 0;
      uStack_1448 = 0;
      auVar3._16_8_ = local_1640._0_8_;
      auVar3._0_16_ = local_1630;
      auVar3._24_8_ = local_1640._8_8_;
      local_17c0 = vandps_avx(auVar3,ZEXT1632(auVar4));
      uStack_1590 = auVar63._16_8_;
      uStack_1588 = auVar2._24_8_;
      local_980 = local_1630._0_8_;
      uStack_978 = local_1630._8_8_;
      uStack_970 = local_1640._0_8_;
      uStack_968 = local_1640._8_8_;
      local_9a0 = local_15a0;
      uStack_998 = uStack_1598;
      uStack_990 = uStack_1590;
      uStack_988 = uStack_1588;
      auVar26._16_8_ = local_1640._0_8_;
      auVar26._0_16_ = local_1630;
      auVar26._24_8_ = local_1640._8_8_;
      auVar25._16_8_ = uStack_1590;
      auVar25._0_16_ = _local_15a0;
      auVar25._24_8_ = uStack_1588;
      local_17e0 = vandnps_avx(auVar26,auVar25);
      local_1340 = local_17a0;
      uStack_1338 = uStack_1798;
      uStack_1330 = 0;
      uStack_1328 = 0;
      local_1360 = local_17c0._0_8_;
      uStack_1358 = local_17c0._8_8_;
      uStack_1350 = local_17c0._16_8_;
      uStack_1348 = local_17c0._24_8_;
      _local_17a0 = vsubps_avx(ZEXT1632(auVar4),local_17c0);
      local_1380 = local_15a0;
      uStack_1378 = uStack_1598;
      uStack_1370 = uStack_1590;
      uStack_1368 = uStack_1588;
      local_13a0 = local_17e0._0_8_;
      uStack_1398 = local_17e0._8_8_;
      uStack_1390 = local_17e0._16_8_;
      uStack_1388 = local_17e0._24_8_;
      auVar11._16_8_ = uStack_1590;
      auVar11._0_16_ = _local_15a0;
      auVar11._24_8_ = uStack_1588;
      _local_15a0 = vsubps_avx(auVar11,local_17e0);
      local_1080 = local_17e0._0_8_;
      uVar79 = local_1080;
      uStack_1078 = local_17e0._8_8_;
      uVar80 = uStack_1078;
      uStack_1070 = local_17e0._16_8_;
      uVar81 = uStack_1070;
      uStack_1068 = local_17e0._24_8_;
      uVar82 = uStack_1068;
      local_10a0 = local_17c0._0_8_;
      uVar75 = local_10a0;
      uStack_1098 = local_17c0._8_8_;
      uVar76 = uStack_1098;
      uStack_1090 = local_17c0._16_8_;
      uVar77 = uStack_1090;
      uStack_1088 = local_17c0._24_8_;
      uVar78 = uStack_1088;
      local_1080._0_4_ = local_17e0._0_4_;
      local_1080._4_4_ = local_17e0._4_4_;
      uStack_1078._0_4_ = local_17e0._8_4_;
      uStack_1078._4_4_ = local_17e0._12_4_;
      uStack_1070._0_4_ = local_17e0._16_4_;
      uStack_1070._4_4_ = local_17e0._20_4_;
      uStack_1068._0_4_ = local_17e0._24_4_;
      uStack_1068._4_4_ = local_17e0._28_4_;
      local_10a0._0_4_ = local_17c0._0_4_;
      local_10a0._4_4_ = local_17c0._4_4_;
      uStack_1098._0_4_ = local_17c0._8_4_;
      uStack_1098._4_4_ = local_17c0._12_4_;
      uStack_1090._0_4_ = local_17c0._16_4_;
      uStack_1090._4_4_ = local_17c0._20_4_;
      uStack_1088._0_4_ = local_17c0._24_4_;
      uStack_1088._4_4_ = local_17c0._28_4_;
      local_1520._4_4_ = local_1080._4_4_ + local_10a0._4_4_;
      uStack_1518._4_4_ = uStack_1078._4_4_ + uStack_1098._4_4_;
      uStack_1510._4_4_ = uStack_1070._4_4_ + uStack_1090._4_4_;
      uStack_1508._4_4_ = uStack_1068._4_4_ + uStack_1088._4_4_;
      local_1520 = CONCAT44(local_1520._4_4_,(float)local_1080 + (float)local_10a0);
      uStack_1518 = CONCAT44(uStack_1518._4_4_,(float)uStack_1078 + (float)uStack_1098);
      uStack_1510 = CONCAT44(uStack_1510._4_4_,(float)uStack_1070 + (float)uStack_1090);
      uStack_1508 = CONCAT44(uStack_1508._4_4_,(float)uStack_1068 + (float)uStack_1088);
      local_10c0 = local_15a0;
      uVar71 = local_10c0;
      uStack_10b8 = uStack_1598;
      uVar72 = uStack_10b8;
      uStack_10b0 = uStack_1590;
      uVar73 = uStack_10b0;
      uStack_10a8 = uStack_1588;
      uVar74 = uStack_10a8;
      local_10e0 = local_17a0;
      uVar67 = local_10e0;
      uStack_10d8 = uStack_1798;
      uVar68 = uStack_10d8;
      uStack_10d0 = uStack_1790;
      uVar69 = uStack_10d0;
      uStack_10c8 = uStack_1788;
      uVar70 = uStack_10c8;
      local_10c0._0_4_ = local_15a0._0_4_;
      local_10c0._4_4_ = local_15a0._4_4_;
      uStack_10b8._0_4_ = local_15a0._8_4_;
      uStack_10b8._4_4_ = local_15a0._12_4_;
      uStack_10b0._0_4_ = local_15a0._16_4_;
      uStack_10b0._4_4_ = local_15a0._20_4_;
      uStack_10a8._0_4_ = local_15a0._24_4_;
      uStack_10a8._4_4_ = local_15a0._28_4_;
      local_10e0._0_4_ = local_17a0._0_4_;
      local_10e0._4_4_ = local_17a0._4_4_;
      uStack_10d8._0_4_ = local_17a0._8_4_;
      uStack_10d8._4_4_ = local_17a0._12_4_;
      uStack_10d0._0_4_ = local_17a0._16_4_;
      uStack_10d0._4_4_ = local_17a0._20_4_;
      uStack_10c8._0_4_ = local_17a0._24_4_;
      uStack_10c8._4_4_ = local_17a0._28_4_;
      local_1540._4_4_ = local_10c0._4_4_ + local_10e0._4_4_;
      uStack_1538._4_4_ = uStack_10b8._4_4_ + uStack_10d8._4_4_;
      uStack_1530._4_4_ = uStack_10b0._4_4_ + uStack_10d0._4_4_;
      uStack_1528._4_4_ = uStack_10a8._4_4_ + uStack_10c8._4_4_;
      local_1540 = CONCAT44(local_1540._4_4_,(float)local_10c0 + (float)local_10e0);
      uStack_1538 = CONCAT44(uStack_1538._4_4_,(float)uStack_10b8 + (float)uStack_10d8);
      uStack_1530 = CONCAT44(uStack_1530._4_4_,(float)uStack_10b0 + (float)uStack_10d0);
      uStack_1528 = CONCAT44(uStack_1528._4_4_,(float)uStack_10a8 + (float)uStack_10c8);
      uStack_1570 = auVar64._16_8_;
      uStack_1568 = auVar10._24_8_;
      local_a20 = local_1580;
      uStack_a18 = uStack_1578;
      uStack_a10 = uStack_1570;
      uStack_a08 = uStack_1568;
      local_18e0._0_4_ =
           (uint)((float)local_1080 + (float)local_10a0) ^ (uint)local_9c0 ^ (uint)local_9e0;
      local_18e0._4_4_ = (uint)local_1520._4_4_ ^ local_9c0._4_4_ ^ local_9e0._4_4_;
      local_18e0._8_4_ =
           (uint)((float)uStack_1078 + (float)uStack_1098) ^ (uint)uStack_9b8 ^ (uint)uStack_9d8;
      local_18e0._12_4_ = (uint)uStack_1518._4_4_ ^ uStack_9b8._4_4_ ^ uStack_9d8._4_4_;
      local_18e0._16_4_ =
           (uint)((float)uStack_1070 + (float)uStack_1090) ^ (uint)uStack_9b0 ^ (uint)uStack_9d0;
      local_18e0._20_4_ = (uint)uStack_1510._4_4_ ^ uStack_9b0._4_4_ ^ uStack_9d0._4_4_;
      local_18e0._24_4_ =
           (uint)((float)uStack_1068 + (float)uStack_1088) ^ (uint)uStack_9a8 ^ (uint)uStack_9c8;
      local_18e0._28_4_ = (uint)uStack_1508._4_4_ ^ uStack_9a8._4_4_ ^ uStack_9c8._4_4_;
      local_a60 = local_1650._0_8_;
      uStack_a58 = local_1650._8_8_;
      uStack_a50 = local_1660._0_8_;
      uStack_a48 = local_1660._8_8_;
      local_1900 = (float)((uint)((float)local_10c0 + (float)local_10e0) ^ local_1650._0_4_);
      fStack_18fc = (float)((uint)local_1540._4_4_ ^ local_1650._4_4_);
      fStack_18f8 = (float)((uint)((float)uStack_10b8 + (float)uStack_10d8) ^ local_1650._8_4_);
      fStack_18f4 = (float)((uint)uStack_1538._4_4_ ^ local_1650._12_4_);
      fStack_18f0 = (float)((uint)((float)uStack_10b0 + (float)uStack_10d0) ^ local_1660._0_4_);
      fStack_18ec = (float)((uint)uStack_1530._4_4_ ^ local_1660._4_4_);
      fStack_18e8 = (float)((uint)((float)uStack_10a8 + (float)uStack_10c8) ^ local_1660._8_4_);
      fStack_18e4 = (float)((uint)uStack_1528._4_4_ ^ local_1660._12_4_);
      auVar1._4_4_ = fStack_18fc;
      auVar1._0_4_ = local_1900;
      auVar1._8_4_ = fStack_18f8;
      auVar1._12_4_ = fStack_18f4;
      auVar1._16_4_ = fStack_18f0;
      auVar1._20_4_ = fStack_18ec;
      auVar1._24_4_ = fStack_18e8;
      auVar1._28_4_ = fStack_18e4;
      local_1940 = vcmpps_avx(auVar1,local_1860,0);
      local_1880 = local_8e0._0_8_;
      uStack_1878 = local_8e0._8_8_;
      uStack_1870 = auStack_8d0._0_8_;
      uStack_1868 = auStack_8d0._8_8_;
      local_18a0 = local_1940._0_8_;
      uStack_1898 = local_1940._8_8_;
      uStack_1890 = local_1940._16_8_;
      uStack_1888 = local_1940._24_8_;
      auVar2._16_8_ = auStack_8d0._0_8_;
      auVar2._0_16_ = local_8e0;
      auVar2._24_8_ = auStack_8d0._8_8_;
      local_1960 = vandps_avx(auVar2,local_1940);
      local_1820 = CONCAT44(fStack_18fc,local_1900);
      uStack_1818 = CONCAT44(fStack_18f4,fStack_18f8);
      uStack_1810 = CONCAT44(fStack_18ec,fStack_18f0);
      uStack_1808 = CONCAT44(fStack_18e4,fStack_18e8);
      local_1840._0_4_ = local_1960._0_4_;
      local_1840._4_4_ = local_1960._4_4_;
      uStack_1838._0_4_ = local_1960._8_4_;
      uStack_1838._4_4_ = local_1960._12_4_;
      uStack_1830._0_4_ = local_1960._16_4_;
      uStack_1830._4_4_ = local_1960._20_4_;
      uStack_1828._0_4_ = local_1960._24_4_;
      uStack_1828._4_4_ = local_1960._28_4_;
      local_1900 = local_1900 + (float)local_1840;
      fStack_18fc = fStack_18fc + local_1840._4_4_;
      fStack_18f8 = fStack_18f8 + (float)uStack_1838;
      fStack_18f4 = fStack_18f4 + uStack_1838._4_4_;
      fStack_18f0 = fStack_18f0 + (float)uStack_1830;
      fStack_18ec = fStack_18ec + uStack_1830._4_4_;
      fStack_18e8 = fStack_18e8 + (float)uStack_1828;
      fStack_18e4 = fStack_18e4 + uStack_1828._4_4_;
      local_920 = CONCAT44(fStack_18fc,local_1900);
      uStack_918 = CONCAT44(fStack_18f4,fStack_18f8);
      uStack_910 = CONCAT44(fStack_18ec,fStack_18f0);
      uStack_908 = CONCAT44(fStack_18e4,fStack_18e8);
      auVar29._8_8_ = uStack_918;
      auVar29._0_8_ = local_920;
      auVar29._16_8_ = uStack_910;
      auVar29._24_8_ = uStack_908;
      local_1980 = vdivps_avx(local_18e0,auVar29);
      local_1b60 = local_1980._0_8_;
      uStack_1b58 = local_1980._8_8_;
      uStack_1b50 = local_1980._16_8_;
      uStack_1b48 = local_1980._24_8_;
      local_1a50 = local_1af0;
      local_1a80 = local_1980._0_8_;
      uStack_1a78 = local_1980._8_8_;
      uStack_1a70 = local_1980._16_8_;
      uStack_1a68 = local_1980._24_8_;
      *local_1af0 = local_1980;
      local_1af0 = local_1af0 + 1;
      local_1840 = local_1960._0_8_;
      uStack_1838 = local_1960._8_8_;
      uStack_1830 = local_1960._16_8_;
      uStack_1828 = local_1960._24_8_;
      _local_1580 = auVar10;
      local_14e0 = auVar115;
      uStack_13f0 = uStack_18b0;
      uStack_13e8 = uStack_18a8;
      uStack_13b0 = uStack_18b0;
      uStack_13a8 = uStack_18a8;
      local_1320 = local_1860;
      local_12e0 = uVar93;
      uStack_12d8 = uVar94;
      local_1260 = uVar95;
      uStack_1258 = uVar96;
      local_1220 = uVar97;
      uStack_1218 = uVar98;
      local_11e0 = uVar99;
      uStack_11d8 = uVar100;
      uStack_11d0 = uVar65;
      uStack_11c8 = uVar66;
      local_11b0 = local_11b8;
      local_1190 = local_11a8;
      local_1180 = local_1198;
      local_1178 = local_11a8;
      local_1168 = local_1198;
      local_1150 = local_1198;
      local_1148 = local_1160;
      local_1140 = local_11b8;
      local_1130 = local_1160;
      local_1128 = local_11b8;
      local_1118 = local_1160;
      local_1110 = local_11b8;
      local_1100 = local_1160;
      local_10f8 = local_1160;
      local_10e8 = local_1198;
      local_10e0 = uVar67;
      uStack_10d8 = uVar68;
      uStack_10d0 = uVar69;
      uStack_10c8 = uVar70;
      local_10c0 = uVar71;
      uStack_10b8 = uVar72;
      uStack_10b0 = uVar73;
      uStack_10a8 = uVar74;
      local_10a0 = uVar75;
      uStack_1098 = uVar76;
      uStack_1090 = uVar77;
      uStack_1088 = uVar78;
      local_1080 = uVar79;
      uStack_1078 = uVar80;
      uStack_1070 = uVar81;
      uStack_1068 = uVar82;
      local_1040 = uVar83;
      uStack_1038 = uVar84;
      local_a70 = local_a80;
      local_a40 = local_1540;
      uStack_a38 = uStack_1538;
      uStack_a30 = uStack_1530;
      uStack_a28 = uStack_1528;
      local_a00 = local_1520;
      uStack_9f8 = uStack_1518;
      uStack_9f0 = uStack_1510;
      uStack_9e8 = uStack_1508;
      local_9e0 = uVar85;
      uStack_9d8 = uVar86;
      uStack_9d0 = uVar87;
      uStack_9c8 = uVar88;
      local_9c0 = uVar89;
      uStack_9b8 = uVar90;
      uStack_9b0 = uVar91;
      uStack_9a8 = uVar92;
    }
    for (; fVar113 = uStack_6d8._4_4_, fVar111 = local_6e0._4_4_, fVar109 = uStack_6e8._4_4_,
        fVar108 = local_6f0._4_4_, local_19d8 = local_1a90, uVar93 = local_1540,
        uVar94 = uStack_1538, uVar95 = uStack_1530, uVar96 = uStack_1528, uVar97 = local_1520,
        uVar98 = uStack_1518, uVar99 = uStack_1510, uVar100 = uStack_1508, local_1b18 = local_1a28,
        local_1b3c + 3 < local_1ae4; local_1b3c = local_1b3c + 4) {
      local_1a48 = local_1af0;
      local_840 = *(undefined8 *)*local_1af0;
      uStack_838 = *(undefined8 *)(*local_1af0 + 8);
      local_1998 = local_1ac9;
      local_19a0 = &local_1b70;
      local_7c4 = 0x322bcc77;
      local_7e0 = 0x322bcc77;
      uStack_7dc = 0x322bcc77;
      uStack_7d8 = 0x322bcc77;
      uStack_7d4 = 0x322bcc77;
      local_870 = 0x322bcc77322bcc77;
      uStack_868 = 0x322bcc77322bcc77;
      local_6c8 = local_850;
      local_6d0 = &local_860;
      local_810 = ZEXT816(0) << 0x20;
      local_5e0._8_8_ = SUB168(ZEXT816(0),4);
      local_640 = 0x7fffffff7fffffff;
      uStack_638 = 0x7fffffff7fffffff;
      auVar32._8_8_ = 0x7fffffff7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar5 = vpand_avx(*(undefined1 (*) [16])*local_1af0,auVar32);
      local_660 = 0x8000000080000000;
      uStack_658 = 0x8000000080000000;
      auVar31._8_8_ = 0x8000000080000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar6 = vpand_avx(*(undefined1 (*) [16])*local_1af0,auVar31);
      local_6c0._0_8_ = auVar5._0_8_;
      local_6c0._8_8_ = auVar5._8_8_;
      local_540 = local_6c0._0_8_;
      uVar99 = local_540;
      uStack_538 = local_6c0._8_8_;
      uVar100 = uStack_538;
      local_550 = 0x3fa2f9833fa2f983;
      uStack_548 = 0x3fa2f9833fa2f983;
      local_540._0_4_ = auVar5._0_4_;
      local_540._4_4_ = auVar5._4_4_;
      uStack_538._0_4_ = auVar5._8_4_;
      uStack_538._4_4_ = auVar5._12_4_;
      local_720._4_4_ = local_540._4_4_ * 1.2732395;
      local_720._0_4_ = (float)local_540 * 1.2732395;
      uStack_718._0_4_ = (float)uStack_538 * 1.2732395;
      uStack_718._4_4_ = uStack_538._4_4_ * 1.2732395;
      local_470 = local_720;
      uStack_468 = uStack_718;
      local_740._4_4_ = (int)(local_540._4_4_ * 1.2732395);
      local_740._0_4_ = (int)((float)local_540 * 1.2732395);
      local_740._8_4_ = (int)((float)uStack_538 * 1.2732395);
      local_740._12_4_ = (int)(uStack_538._4_4_ * 1.2732395);
      local_520 = local_740._0_8_;
      uStack_518 = local_740._8_8_;
      local_530 = 0x100000001;
      uStack_528 = 0x100000001;
      auVar35._8_8_ = local_740._8_8_;
      auVar35._0_8_ = local_740._0_8_;
      auVar34._8_8_ = 0x100000001;
      auVar34._0_8_ = 0x100000001;
      auVar4 = vpaddd_avx(auVar35,auVar34);
      local_740._0_8_ = auVar4._0_8_;
      local_740._8_8_ = auVar4._8_8_;
      local_150 = local_740._0_8_;
      uStack_148 = local_740._8_8_;
      local_160 = 0xfffffffefffffffe;
      uStack_158 = 0xfffffffefffffffe;
      auVar44._8_8_ = 0xfffffffefffffffe;
      auVar44._0_8_ = 0xfffffffefffffffe;
      auVar7 = vpand_avx(auVar4,auVar44);
      local_740._0_8_ = auVar7._0_8_;
      local_1b0 = local_740._0_8_;
      local_740._8_8_ = auVar7._8_8_;
      uStack_1a8 = local_740._8_8_;
      local_460 = local_740._0_8_;
      uStack_458 = local_740._8_8_;
      auVar4 = vcvtdq2ps_avx(auVar7);
      local_170 = local_740._0_8_;
      uStack_168 = local_740._8_8_;
      local_180 = 0x400000004;
      uStack_178 = 0x400000004;
      auVar43._8_8_ = 0x400000004;
      auVar43._0_8_ = 0x400000004;
      auVar8 = vpand_avx(auVar7,auVar43);
      local_730._0_8_ = auVar8._0_8_;
      local_730._8_8_ = auVar8._8_8_;
      local_4e0 = local_730._0_8_;
      uStack_4d8 = local_730._8_8_;
      local_4e4 = 0x1d;
      local_730 = vpslld_avx(auVar8,ZEXT416(0x1d));
      local_690 = local_730._0_8_;
      uStack_688 = local_730._8_8_;
      local_760 = local_730._0_8_;
      uStack_758 = local_730._8_8_;
      local_190 = local_740._0_8_;
      uStack_188 = local_740._8_8_;
      local_1a0 = 0x200000002;
      uStack_198 = 0x200000002;
      auVar42._8_8_ = 0x200000002;
      auVar42._0_8_ = 0x200000002;
      auVar8 = vpand_avx(auVar7,auVar42);
      local_740._0_8_ = auVar8._0_8_;
      local_740._8_8_ = auVar8._8_8_;
      local_120._8_8_ = SUB168(ZEXT816(0),4);
      local_130 = local_740._0_8_;
      uStack_128 = local_740._8_8_;
      local_140 = 0;
      uStack_138 = local_120._8_8_;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_120._8_8_;
      local_740 = vpcmpeqd_avx(auVar8,auVar61 << 0x40);
      local_6a0 = local_740._0_8_;
      uStack_698 = local_740._8_8_;
      local_770 = local_740._0_8_;
      uStack_768 = local_740._8_8_;
      local_448 = local_720;
      local_380 = &local_6e0;
      local_430 = local_6c0;
      local_720 = auVar4._0_8_;
      local_320 = local_720;
      uStack_718 = auVar4._8_8_;
      uStack_318 = uStack_718;
      local_330 = 0xbf490000bf490000;
      uStack_328 = 0xbf490000bf490000;
      auVar58._8_4_ = 0xbf490000;
      auVar58._0_8_ = 0xbf490000bf490000;
      auVar58._12_4_ = 0xbf490000;
      local_340 = local_6c0._0_8_;
      uStack_338 = local_6c0._8_8_;
      auVar5 = vfmadd213ps_fma(auVar58,auVar4,auVar5);
      local_398 = &local_6f0;
      local_2f0 = local_720;
      uStack_2e8 = uStack_718;
      local_300 = 0xb97da000b97da000;
      uStack_2f8 = 0xb97da000b97da000;
      auVar57._8_4_ = 0xb97da000;
      auVar57._0_8_ = 0xb97da000b97da000;
      auVar57._12_4_ = 0xb97da000;
      local_6c0._0_8_ = auVar5._0_8_;
      local_310 = local_6c0._0_8_;
      local_6c0._8_8_ = auVar5._8_8_;
      uStack_308 = local_6c0._8_8_;
      auVar5 = vfmadd213ps_fma(auVar57,auVar4,auVar5);
      local_3b0 = &local_700;
      local_2c0 = local_720;
      uStack_2b8 = uStack_718;
      local_2d0 = 0xb3222169b3222169;
      uStack_2c8 = 0xb3222169b3222169;
      auVar56._8_8_ = 0xb3222169b3222169;
      auVar56._0_8_ = 0xb3222169b3222169;
      local_6c0._0_8_ = auVar5._0_8_;
      local_2e0 = local_6c0._0_8_;
      local_6c0._8_8_ = auVar5._8_8_;
      uStack_2d8 = local_6c0._8_8_;
      local_6c0 = vfmadd213ps_fma(auVar56,auVar4,auVar5);
      local_1c0 = 0x200000002;
      uStack_1b8 = 0x200000002;
      auVar41._8_8_ = 0x200000002;
      auVar41._0_8_ = 0x200000002;
      auVar4 = vpsubd_avx(auVar7,auVar41);
      local_750._0_8_ = auVar4._0_8_;
      local_750._8_8_ = auVar4._8_8_;
      local_80 = local_750._0_8_;
      uStack_78 = local_750._8_8_;
      local_90 = 0x400000004;
      uStack_88 = 0x400000004;
      auVar46._8_8_ = 0x400000004;
      auVar46._0_8_ = 0x400000004;
      auVar4 = vpandn_avx(auVar4,auVar46);
      local_750._0_8_ = auVar4._0_8_;
      local_750._8_8_ = auVar4._8_8_;
      local_500 = local_750._0_8_;
      uStack_4f8 = local_750._8_8_;
      local_504 = 0x1d;
      local_750 = vpslld_avx(auVar4,ZEXT416(0x1d));
      local_6b0 = local_750._0_8_;
      uStack_6a8 = local_750._8_8_;
      local_780 = local_750._0_8_;
      uStack_778 = local_750._8_8_;
      local_710 = auVar6._0_8_;
      uStack_708 = auVar6._8_8_;
      local_c0 = local_710;
      uStack_b8 = uStack_708;
      local_d0 = local_730._0_8_;
      uStack_c8 = local_730._8_8_;
      local_f0 = local_710 ^ local_730._0_8_;
      uStack_e8 = uStack_708 ^ local_730._8_8_;
      uStack_708 = uStack_e8;
      local_710 = local_f0;
      local_560 = local_6c0._0_8_;
      uVar97 = local_560;
      uStack_558 = local_6c0._8_8_;
      uVar98 = uStack_558;
      local_570 = local_6c0._0_8_;
      uStack_568 = local_6c0._8_8_;
      local_560._0_4_ = local_6c0._0_4_;
      local_560._4_4_ = local_6c0._4_4_;
      uStack_558._0_4_ = local_6c0._8_4_;
      uStack_558._4_4_ = local_6c0._12_4_;
      local_790 = (float)local_560 * (float)local_560;
      fStack_78c = local_560._4_4_ * local_560._4_4_;
      fStack_788 = (float)uStack_558 * (float)uStack_558;
      fStack_784 = uStack_558._4_4_ * uStack_558._4_4_;
      uStack_718 = 0x37ccf5ce37ccf5ce;
      local_720 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      local_438 = &local_790;
      local_3d0 = _ps_coscof_p1;
      local_290 = 0x37ccf5ce37ccf5ce;
      uStack_288 = 0x37ccf5ce37ccf5ce;
      local_2a0 = CONCAT44(fStack_78c,local_790);
      uStack_298 = CONCAT44(fStack_784,fStack_788);
      auVar51._4_4_ = fStack_78c;
      auVar51._0_4_ = local_790;
      auVar51._8_4_ = fStack_788;
      auVar51._12_4_ = fStack_784;
      local_2b0[0] = -0.0013887316;
      local_2b0[1] = -0.0013887316;
      afStack_2a8[0] = -0.0013887316;
      afStack_2a8[1] = -0.0013887316;
      auVar37._8_4_ = -0.0013887316;
      auVar37._12_4_ = -0.0013887316;
      auVar37._0_4_ = -0.0013887316;
      auVar37._4_4_ = -0.0013887316;
      auVar4 = vfmadd213ps_fma(auVar51,_local_720,auVar37);
      local_3e8 = _ps_coscof_p2;
      local_720 = auVar4._0_8_;
      local_260 = local_720;
      uStack_718 = auVar4._8_8_;
      uStack_258 = uStack_718;
      local_270 = CONCAT44(fStack_78c,local_790);
      uStack_268 = CONCAT44(fStack_784,fStack_788);
      auVar52._4_4_ = fStack_78c;
      auVar52._0_4_ = local_790;
      auVar52._8_4_ = fStack_788;
      auVar52._12_4_ = fStack_784;
      local_280[0] = 0.041666646;
      local_280[1] = 0.041666646;
      afStack_278[0] = 0.041666646;
      afStack_278[1] = 0.041666646;
      auVar38._8_4_ = 0.041666646;
      auVar38._12_4_ = 0.041666646;
      auVar38._0_4_ = 0.041666646;
      auVar38._4_4_ = 0.041666646;
      auVar4 = vfmadd213ps_fma(auVar52,auVar4,auVar38);
      local_720 = auVar4._0_8_;
      uStack_718 = auVar4._8_8_;
      local_590 = CONCAT44(fStack_78c,local_790);
      uStack_588 = CONCAT44(fStack_784,fStack_788);
      local_580 = local_720;
      uVar95 = local_580;
      uStack_578 = uStack_718;
      uVar96 = uStack_578;
      local_580._0_4_ = auVar4._0_4_;
      local_580._4_4_ = auVar4._4_4_;
      uStack_578._0_4_ = auVar4._8_4_;
      uStack_578._4_4_ = auVar4._12_4_;
      local_720._4_4_ = local_580._4_4_ * fStack_78c;
      local_720._0_4_ = (float)local_580 * local_790;
      uStack_718._0_4_ = (float)uStack_578 * fStack_788;
      uStack_718._4_4_ = uStack_578._4_4_ * fStack_784;
      local_5b0 = CONCAT44(fStack_78c,local_790);
      uStack_5a8 = CONCAT44(fStack_784,fStack_788);
      local_5a0 = local_720;
      uStack_598 = uStack_718;
      local_720._4_4_ = local_580._4_4_ * fStack_78c * fStack_78c;
      local_720._0_4_ = (float)local_580 * local_790 * local_790;
      uStack_718._0_4_ = (float)uStack_578 * fStack_788 * fStack_788;
      uStack_718._4_4_ = uStack_578._4_4_ * fStack_784 * fStack_784;
      local_440 = ::_ps_0p5;
      local_350 = CONCAT44(fStack_78c,local_790);
      uStack_348 = CONCAT44(fStack_784,fStack_788);
      auVar53._4_4_ = fStack_78c;
      auVar53._0_4_ = local_790;
      auVar53._8_4_ = fStack_788;
      auVar53._12_4_ = fStack_784;
      local_360[0] = 0.5;
      local_360[1] = 0.5;
      afStack_358[0] = 0.5;
      afStack_358[1] = 0.5;
      local_370 = local_720;
      uStack_368 = uStack_718;
      auVar36._8_4_ = 0.5;
      auVar36._12_4_ = 0.5;
      auVar36._0_4_ = 0.5;
      auVar36._4_4_ = 0.5;
      auVar4 = vfnmadd213ps_fma(auVar36,auVar53,_local_720);
      local_720 = auVar4._0_8_;
      uStack_718 = auVar4._8_8_;
      local_480 = local_720;
      uVar73 = local_480;
      uStack_478 = uStack_718;
      uVar74 = uStack_478;
      local_490 = 0x3f8000003f800000;
      uStack_488 = 0x3f8000003f800000;
      local_480._0_4_ = auVar4._0_4_;
      local_480._4_4_ = auVar4._4_4_;
      uStack_478._0_4_ = auVar4._8_4_;
      uStack_478._4_4_ = auVar4._12_4_;
      local_720._4_4_ = local_480._4_4_ + 1.0;
      local_720._0_4_ = (float)local_480 + 1.0;
      uStack_718._0_4_ = (float)uStack_478 + 1.0;
      uStack_718._4_4_ = uStack_478._4_4_ + 1.0;
      uStack_798 = 0xb94ca1f9b94ca1f9;
      local_7a0 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      local_420 = local_7a0;
      local_400 = _ps_sincof_p1;
      local_230 = 0xb94ca1f9b94ca1f9;
      uStack_228 = 0xb94ca1f9b94ca1f9;
      local_240 = CONCAT44(fStack_78c,local_790);
      uStack_238 = CONCAT44(fStack_784,fStack_788);
      auVar54._4_4_ = fStack_78c;
      auVar54._0_4_ = local_790;
      auVar54._8_4_ = fStack_788;
      auVar54._12_4_ = fStack_784;
      local_250[0] = 0.008332161;
      local_250[1] = 0.008332161;
      afStack_248[0] = 0.008332161;
      afStack_248[1] = 0.008332161;
      auVar39._8_4_ = 0.008332161;
      auVar39._12_4_ = 0.008332161;
      auVar39._0_4_ = 0.008332161;
      auVar39._4_4_ = 0.008332161;
      auVar4 = vfmadd213ps_fma(auVar54,_local_7a0,auVar39);
      local_418 = _ps_sincof_p2;
      local_7a0 = auVar4._0_8_;
      local_200 = local_7a0;
      uStack_798 = auVar4._8_8_;
      uStack_1f8 = uStack_798;
      local_210 = CONCAT44(fStack_78c,local_790);
      uStack_208 = CONCAT44(fStack_784,fStack_788);
      auVar55._4_4_ = fStack_78c;
      auVar55._0_4_ = local_790;
      auVar55._8_4_ = fStack_788;
      auVar55._12_4_ = fStack_784;
      local_220[0] = -0.16666655;
      local_220[1] = -0.16666655;
      afStack_218[0] = -0.16666655;
      afStack_218[1] = -0.16666655;
      auVar40._8_4_ = -0.16666655;
      auVar40._12_4_ = -0.16666655;
      auVar40._0_4_ = -0.16666655;
      auVar40._4_4_ = -0.16666655;
      auVar4 = vfmadd213ps_fma(auVar55,auVar4,auVar40);
      local_7a0 = auVar4._0_8_;
      uStack_798 = auVar4._8_8_;
      local_5d0 = CONCAT44(fStack_78c,local_790);
      uStack_5c8 = CONCAT44(fStack_784,fStack_788);
      local_5c0 = local_7a0;
      uVar93 = local_5c0;
      uStack_5b8 = uStack_798;
      uVar94 = uStack_5b8;
      local_5c0._0_4_ = auVar4._0_4_;
      local_5c0._4_4_ = auVar4._4_4_;
      uStack_5b8._0_4_ = auVar4._8_4_;
      uStack_5b8._4_4_ = auVar4._12_4_;
      local_7a0._4_4_ = local_5c0._4_4_ * fStack_78c;
      local_7a0._0_4_ = (float)local_5c0 * local_790;
      uStack_798._0_4_ = (float)uStack_5b8 * fStack_788;
      uStack_798._4_4_ = uStack_5b8._4_4_ * fStack_784;
      local_1d0 = local_7a0;
      uStack_1c8 = uStack_798;
      local_1e0 = local_6c0._0_8_;
      uStack_1d8 = local_6c0._8_8_;
      local_1f0 = local_6c0._0_8_;
      uStack_1e8 = local_6c0._8_8_;
      auVar4 = vfmadd213ps_fma(local_6c0,_local_7a0,local_6c0);
      local_700 = local_740._0_8_;
      uStack_6f8 = local_740._8_8_;
      local_7a0 = auVar4._0_8_;
      uStack_798 = auVar4._8_8_;
      local_670 = local_740._0_8_;
      uStack_668 = local_740._8_8_;
      local_680 = local_7a0;
      uStack_678 = uStack_798;
      local_7b0 = vpand_avx(local_740,auVar4);
      local_a0 = local_740._0_8_;
      uStack_98 = local_740._8_8_;
      local_b0 = local_720;
      uStack_a8 = uStack_718;
      auVar45._8_8_ = uStack_718;
      auVar45._0_8_ = local_720;
      local_7c0 = vpandn_avx(local_740,auVar45);
      local_5f0 = local_7a0;
      uStack_5e8 = uStack_798;
      local_600 = local_7b0._0_8_;
      uStack_5f8 = local_7b0._8_8_;
      _local_7a0 = vsubps_avx(auVar4,local_7b0);
      local_610 = local_720;
      uStack_608 = uStack_718;
      local_620 = local_7c0._0_8_;
      uStack_618 = local_7c0._8_8_;
      auVar33._8_8_ = uStack_718;
      auVar33._0_8_ = local_720;
      _local_720 = vsubps_avx(auVar33,local_7c0);
      local_4a0 = local_7c0._0_8_;
      uVar71 = local_4a0;
      uStack_498 = local_7c0._8_8_;
      uVar72 = uStack_498;
      local_4b0 = local_7b0._0_8_;
      uVar69 = local_4b0;
      uStack_4a8 = local_7b0._8_8_;
      uVar70 = uStack_4a8;
      local_4a0._0_4_ = local_7c0._0_4_;
      local_4a0._4_4_ = local_7c0._4_4_;
      uStack_498._0_4_ = local_7c0._8_4_;
      uStack_498._4_4_ = local_7c0._12_4_;
      local_4b0._0_4_ = local_7b0._0_4_;
      local_4b0._4_4_ = local_7b0._4_4_;
      uStack_4a8._0_4_ = local_7b0._8_4_;
      uStack_4a8._4_4_ = local_7b0._12_4_;
      local_6e0._4_4_ = local_4a0._4_4_ + local_4b0._4_4_;
      uStack_6d8._4_4_ = uStack_498._4_4_ + uStack_4a8._4_4_;
      local_6e0 = CONCAT44(local_6e0._4_4_,(float)local_4a0 + (float)local_4b0);
      uStack_6d8 = CONCAT44(uStack_6d8._4_4_,(float)uStack_498 + (float)uStack_4a8);
      local_4c0 = local_720;
      uVar67 = local_4c0;
      uStack_4b8 = uStack_718;
      uVar68 = uStack_4b8;
      local_4d0 = local_7a0;
      uVar65 = local_4d0;
      uStack_4c8 = uStack_798;
      uVar66 = uStack_4c8;
      local_4c0._0_4_ = local_720._0_4_;
      local_4c0._4_4_ = local_720._4_4_;
      uStack_4b8._0_4_ = local_720._8_4_;
      uStack_4b8._4_4_ = local_720._12_4_;
      local_4d0._0_4_ = local_7a0._0_4_;
      local_4d0._4_4_ = local_7a0._4_4_;
      uStack_4c8._0_4_ = local_7a0._8_4_;
      uStack_4c8._4_4_ = local_7a0._12_4_;
      local_6f0._4_4_ = local_4c0._4_4_ + local_4d0._4_4_;
      uStack_6e8._4_4_ = uStack_4b8._4_4_ + uStack_4c8._4_4_;
      local_6f0 = CONCAT44(local_6f0._4_4_,(float)local_4c0 + (float)local_4d0);
      uStack_6e8 = CONCAT44(uStack_6e8._4_4_,(float)uStack_4b8 + (float)uStack_4c8);
      local_850._0_8_ = local_6e0 ^ local_f0;
      local_850._8_8_ = uStack_6d8 ^ uStack_e8;
      local_110 = local_750._0_8_;
      uStack_108 = local_750._8_8_;
      auVar9._8_8_ = uStack_6e8;
      auVar9._0_8_ = local_6f0;
      auVar9 = auVar9 ^ local_750;
      fStack_854 = auVar9._12_4_;
      fStack_858 = auVar9._8_4_;
      fStack_85c = auVar9._4_4_;
      local_860 = auVar9._0_4_;
      local_7f0 = auVar9._0_8_;
      uStack_7e8 = auVar9._8_8_;
      local_70 = 0;
      uStack_68 = local_5e0._8_8_;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_5e0._8_8_;
      local_880 = vcmpps_avx(auVar9,auVar62 << 0x40,0);
      local_820 = 0x322bcc77322bcc77;
      uStack_818 = 0x322bcc77322bcc77;
      local_830 = local_880._0_8_;
      uStack_828 = local_880._8_8_;
      auVar30._8_8_ = 0x322bcc77322bcc77;
      auVar30._0_8_ = 0x322bcc77322bcc77;
      local_890 = vpand_avx(auVar30,local_880);
      local_800._0_4_ = local_890._0_4_;
      local_800._4_4_ = local_890._4_4_;
      uStack_7f8._0_4_ = local_890._8_4_;
      uStack_7f8._4_4_ = local_890._12_4_;
      local_860 = local_860 + (float)local_800;
      fStack_85c = fStack_85c + local_800._4_4_;
      fStack_858 = fStack_858 + (float)uStack_7f8;
      fStack_854 = fStack_854 + uStack_7f8._4_4_;
      local_50 = CONCAT44(fStack_85c,local_860);
      uStack_48 = CONCAT44(fStack_854,fStack_858);
      auVar47._8_8_ = uStack_48;
      auVar47._0_8_ = local_50;
      local_8a0 = vdivps_avx(local_850,auVar47);
      local_1b70 = local_8a0._0_8_;
      uStack_1b68 = local_8a0._8_8_;
      local_1a30 = local_1af0;
      local_1a40 = local_8a0._0_8_;
      uStack_1a38 = local_8a0._8_8_;
      *(undefined1 (*) [16])*local_1af0 = local_8a0;
      local_1af0 = (undefined1 (*) [32])(*local_1af0 + 0x10);
      local_800 = local_890._0_8_;
      uStack_7f8 = local_890._8_8_;
      local_650 = local_840;
      uStack_648 = uStack_838;
      local_630 = local_840;
      uStack_628 = uStack_838;
      local_5e0 = local_810;
      local_5c0 = uVar93;
      uStack_5b8 = uVar94;
      local_580 = uVar95;
      uStack_578 = uVar96;
      local_560 = uVar97;
      uStack_558 = uVar98;
      local_540 = uVar99;
      uStack_538 = uVar100;
      local_4d0 = uVar65;
      uStack_4c8 = uVar66;
      local_4c0 = uVar67;
      uStack_4b8 = uVar68;
      local_4b0 = uVar69;
      uStack_4a8 = uVar70;
      local_4a0 = uVar71;
      uStack_498 = uVar72;
      local_480 = uVar73;
      uStack_478 = uVar74;
      local_428 = local_430;
      local_410 = local_438;
      local_408 = local_420;
      local_3f8 = local_438;
      local_3f0 = local_420;
      local_3e0 = local_438;
      local_3d8 = local_448;
      local_3c8 = local_438;
      local_3c0 = local_448;
      local_3b8 = local_430;
      local_3a8 = local_448;
      local_3a0 = local_430;
      local_390 = local_448;
      local_388 = local_430;
      local_378 = local_448;
      local_120 = ZEXT816(0) << 0x20;
      local_100 = local_6f0;
      uStack_f8 = uStack_6e8;
      local_e0 = local_6e0;
      uStack_d8 = uStack_6d8;
      local_60 = local_7f0;
      uStack_58 = uStack_7e8;
    }
    for (; uStack_6d8._4_4_ = fVar113, local_6e0._4_4_ = fVar111, uStack_6e8._4_4_ = fVar109,
        local_6f0._4_4_ = fVar108, uStack_1508._4_4_ = fVar107, uStack_1510._4_4_ = fVar106,
        uStack_1518._4_4_ = fVar105, local_1520._4_4_ = fVar104, uStack_1528._4_4_ = fVar103,
        uStack_1530._4_4_ = fVar102, uStack_1538._4_4_ = fVar101, local_1540._4_4_ = fVar114,
        uStack_1508 = uVar100, uStack_1510 = uVar99, uStack_1518 = uVar98, local_1520 = uVar97,
        uStack_1528 = uVar96, uStack_1530 = uVar95, uStack_1538 = uVar94, local_1540 = uVar93,
        fVar113 = uStack_6d8._4_4_, fVar111 = local_6e0._4_4_, fVar109 = uStack_6e8._4_4_,
        fVar108 = local_6f0._4_4_, fVar107 = uStack_1508._4_4_, fVar106 = uStack_1510._4_4_,
        fVar105 = uStack_1518._4_4_, fVar104 = local_1520._4_4_, fVar103 = uStack_1528._4_4_,
        fVar102 = uStack_1530._4_4_, fVar101 = uStack_1538._4_4_, fVar114 = local_1540._4_4_,
        local_1b3c < local_1ae4; local_1b3c = local_1b3c + 1) {
      local_1988 = local_1ac9;
      local_1990 = local_1af0;
      uVar93 = local_1540;
      local_1540._4_4_ = fVar114;
      uVar94 = uStack_1538;
      uStack_1538._4_4_ = fVar101;
      uVar95 = uStack_1530;
      uStack_1530._4_4_ = fVar102;
      uVar96 = uStack_1528;
      uStack_1528._4_4_ = fVar103;
      uVar97 = local_1520;
      local_1520._4_4_ = fVar104;
      uVar98 = uStack_1518;
      uStack_1518._4_4_ = fVar105;
      uVar99 = uStack_1510;
      uStack_1510._4_4_ = fVar106;
      uVar100 = uStack_1508;
      uStack_1508._4_4_ = fVar107;
      uVar65 = local_6f0;
      local_6f0._4_4_ = fVar108;
      uVar66 = uStack_6e8;
      uStack_6e8._4_4_ = fVar109;
      uVar110 = local_6e0;
      local_6e0._4_4_ = fVar111;
      uVar112 = uStack_6d8;
      uStack_6d8._4_4_ = fVar113;
      fVar114 = tanf(*(float *)*local_1af0);
      fVar113 = uStack_6d8._4_4_;
      fVar111 = local_6e0._4_4_;
      fVar109 = uStack_6e8._4_4_;
      fVar108 = local_6f0._4_4_;
      uVar100 = uStack_1508;
      uVar99 = uStack_1510;
      uVar98 = uStack_1518;
      uVar97 = local_1520;
      uVar96 = uStack_1528;
      uVar95 = uStack_1530;
      uVar94 = uStack_1538;
      uVar93 = local_1540;
      *(float *)*local_1af0 = fVar114;
      local_1af0 = (undefined1 (*) [32])(*local_1af0 + 4);
      fVar114 = local_1540._4_4_;
      fVar101 = uStack_1538._4_4_;
      fVar102 = uStack_1530._4_4_;
      fVar103 = uStack_1528._4_4_;
      fVar104 = local_1520._4_4_;
      fVar105 = uStack_1518._4_4_;
      fVar106 = uStack_1510._4_4_;
      fVar107 = uStack_1508._4_4_;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}